

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloth_decorator.h
# Opt level: O3

void __thiscall
decorator::ClothDecorator::ClothDecorator(ClothDecorator *this,shared_ptr<decorator::Human> *human)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  
  peVar1 = (human->super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (human->super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0011ad66;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar2 = __libc_single_threaded != '\0';
    (this->super_WomenDecorator).super_Human._vptr_Human = (_func_int **)&PTR_Outlook_001298b8;
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    if (bVar2) goto LAB_0011ad5e;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (this->super_WomenDecorator).super_Human._vptr_Human = (_func_int **)&PTR_Outlook_001298b8;
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
LAB_0011ad5e:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_0011ad66:
  (this->super_WomenDecorator).super_Human._vptr_Human = (_func_int **)&PTR_Outlook_001298d0;
  return;
}

Assistant:

ClothDecorator::ClothDecorator(std::shared_ptr<Human> human)
        : WomenDecorator(human) {}